

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse4.h
# Opt level: O2

void av1_round_shift_rect_array_32_sse4_1(__m128i *input,__m128i *output,int size,int bit,int val)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  __m128i round;
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (bit < 1) {
    uVar3 = 0;
    uVar4 = (ulong)(uint)size;
    if (size < 1) {
      uVar4 = uVar3;
    }
    auVar6 = pmovsxwd(in_XMM1,0x16a116a116a116a1);
    auVar7 = pmovsxwd(in_XMM2,0x800080008000800);
    for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      piVar1 = (int *)((long)*input + uVar3);
      auVar8._0_4_ = *piVar1 << -bit;
      auVar8._4_4_ = piVar1[1];
      auVar8._8_4_ = piVar1[2];
      auVar8._12_4_ = piVar1[3];
      auVar8 = pmulld(auVar8,auVar6);
      piVar1 = (int *)((long)*output + uVar3);
      *piVar1 = auVar8._0_4_ + auVar7._0_4_ >> 0xc;
      piVar1[1] = auVar8._4_4_ + auVar7._4_4_ >> 0xc;
      piVar1[2] = auVar8._8_4_ + auVar7._8_4_ >> 0xc;
      piVar1[3] = auVar8._12_4_ + auVar7._12_4_ >> 0xc;
    }
  }
  else {
    iVar5 = 1 << ((char)bit - 1U & 0x1f);
    lVar2 = 0;
    uVar4 = (ulong)(uint)size;
    if (size < 1) {
      uVar4 = 0;
    }
    auVar6 = ZEXT416((uint)bit);
    auVar7 = pmovsxwd(in_XMM2,0x16a116a116a116a1);
    auVar8 = pmovsxwd(in_XMM3,0x800080008000800);
    for (; uVar4 * 0x10 != lVar2; lVar2 = lVar2 + 0x10) {
      piVar1 = (int *)((long)*input + lVar2);
      auVar9._0_4_ = *piVar1 + iVar5 >> auVar6;
      auVar9._4_4_ = piVar1[1] + iVar5 >> auVar6;
      auVar9._8_4_ = piVar1[2] + iVar5 >> auVar6;
      auVar9._12_4_ = piVar1[3] + iVar5 >> auVar6;
      auVar9 = pmulld(auVar9,auVar7);
      piVar1 = (int *)((long)*output + lVar2);
      *piVar1 = auVar9._0_4_ + auVar8._0_4_ >> 0xc;
      piVar1[1] = auVar9._4_4_ + auVar8._4_4_ >> 0xc;
      piVar1[2] = auVar9._8_4_ + auVar8._8_4_ >> 0xc;
      piVar1[3] = auVar9._12_4_ + auVar8._12_4_ >> 0xc;
    }
  }
  return;
}

Assistant:

static inline void av1_round_shift_rect_array_32_sse4_1(const __m128i *input,
                                                        __m128i *output,
                                                        const int size,
                                                        const int bit,
                                                        const int val) {
  const __m128i sqrt2 = _mm_set1_epi32(val);
  if (bit > 0) {
    int i;
    for (i = 0; i < size; i++) {
      const __m128i r0 = av1_round_shift_32_sse4_1(input[i], bit);
      const __m128i r1 = _mm_mullo_epi32(sqrt2, r0);
      output[i] = av1_round_shift_32_sse4_1(r1, NewSqrt2Bits);
    }
  } else {
    int i;
    for (i = 0; i < size; i++) {
      const __m128i r0 = _mm_slli_epi32(input[i], -bit);
      const __m128i r1 = _mm_mullo_epi32(sqrt2, r0);
      output[i] = av1_round_shift_32_sse4_1(r1, NewSqrt2Bits);
    }
  }
}